

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog.c
# Opt level: O0

wchar_t curses_msgwin(char *msg)

{
  undefined4 uVar1;
  int iVar2;
  wchar_t wVar3;
  size_t sVar4;
  WINDOW_conflict *win_00;
  ushort **ppuVar5;
  WINDOW_conflict *win;
  wchar_t prevcurs;
  wchar_t width;
  wchar_t len;
  wchar_t key;
  char *msg_local;
  
  sVar4 = strlen(msg);
  uVar1 = curs_set(0);
  win_00 = newdialog(L'\x03',(int)sVar4 + L'\x04');
  sVar4 = strlen(msg);
  prevcurs = (wchar_t)sVar4;
  while (ppuVar5 = __ctype_b_loc(),
        ((*ppuVar5)[(int)(uint)(byte)msg[prevcurs + L'\xffffffff']] & 0x2000) != 0) {
    prevcurs = prevcurs + L'\xffffffff';
  }
  iVar2 = wmove(win_00,1,2);
  if (iVar2 != -1) {
    waddnstr(win_00,msg,prevcurs);
  }
  wrefresh(win_00);
  wVar3 = nh_wgetch(win_00);
  delwin(win_00);
  curs_set(uVar1);
  redraw_game_windows();
  return wVar3;
}

Assistant:

int curses_msgwin(const char *msg)
{
    int key, len;
    int width = strlen(msg) + 4;
    int prevcurs = curs_set(0);
    WINDOW *win = newdialog(3, width);
    
    len = strlen(msg);
    while (isspace((unsigned char)msg[len-1]))
	len--;
    
    mvwaddnstr(win, 1, 2, msg, len);
    wrefresh(win);
    key = nh_wgetch(win); /* wait for any key */
    
    delwin(win);
    curs_set(prevcurs);
    redraw_game_windows();
    
    return key;
}